

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

bool __thiscall
Assimp::AMFImporter::Find_NodeElement
          (AMFImporter *this,string *pID,EType pType,CAMFImporter_NodeElement **pNodeElement)

{
  CAMFImporter_NodeElement *pCVar1;
  __type _Var2;
  _List_node_base *p_Var3;
  list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_> *plVar4;
  
  plVar4 = &this->mNodeElement_List;
  p_Var3 = (_List_node_base *)plVar4;
  do {
    p_Var3 = (((_List_base<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>
                *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var3 == (_List_node_base *)plVar4) goto LAB_003c2f09;
    pCVar1 = (CAMFImporter_NodeElement *)p_Var3[1]._M_next;
    _Var2 = std::operator==(&pCVar1->ID,pID);
  } while ((!_Var2) || (pCVar1->Type != pType));
  if (pNodeElement != (CAMFImporter_NodeElement **)0x0) {
    *pNodeElement = pCVar1;
  }
LAB_003c2f09:
  return p_Var3 != (_List_node_base *)plVar4;
}

Assistant:

bool AMFImporter::Find_NodeElement(const std::string& pID, const CAMFImporter_NodeElement::EType pType, CAMFImporter_NodeElement** pNodeElement) const
{
	for(CAMFImporter_NodeElement* ne: mNodeElement_List)
	{
		if((ne->ID == pID) && (ne->Type == pType))
		{
			if(pNodeElement != nullptr) *pNodeElement = ne;

			return true;
		}
	}// for(CAMFImporter_NodeElement* ne: mNodeElement_List)

	return false;
}